

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__decode_jpeg_image(stbi__jpeg *j)

{
  byte bVar1;
  stbi_uc sVar2;
  stbi__jpeg *in_RDI;
  stbi__uint32 NL;
  int Ld;
  int m;
  int in_stack_00000064;
  stbi__jpeg *in_stack_00000068;
  stbi__jpeg *in_stack_00000178;
  stbi__jpeg *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  stbi__uint32 in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  int iVar3;
  int local_4;
  
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    in_RDI->img_comp[iVar3].raw_data = (void *)0x0;
    in_RDI->img_comp[iVar3].raw_coeff = (void *)0x0;
  }
  in_RDI->restart_interval = 0;
  iVar3 = stbi__decode_jpeg_header
                    ((stbi__jpeg *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe4);
  if (iVar3 == 0) {
    local_4 = 0;
  }
  else {
    bVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
    while (bVar1 != 0xd9) {
      if (bVar1 == 0xda) {
        iVar3 = stbi__process_scan_header((stbi__jpeg *)CONCAT44(0xda,in_stack_ffffffffffffffe8));
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = stbi__parse_entropy_coded_data(in_stack_00000178);
        if (iVar3 == 0) {
          return 0;
        }
        if (in_RDI->marker == 0xff) {
          sVar2 = stbi__skip_jpeg_junk_at_end(in_stack_ffffffffffffffd8);
          in_RDI->marker = sVar2;
        }
        bVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
        if ((0xcf < bVar1) && (bVar1 < 0xd8)) {
          bVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
        }
      }
      else if (bVar1 == 0xdc) {
        in_stack_ffffffffffffffe8 =
             stbi__get16be((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        in_stack_ffffffffffffffe4 =
             stbi__get16be((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        if (in_stack_ffffffffffffffe8 != 4) {
          iVar3 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
          return iVar3;
        }
        if (in_stack_ffffffffffffffe4 != in_RDI->s->img_y) {
          iVar3 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
          return iVar3;
        }
        bVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
      }
      else {
        iVar3 = stbi__process_marker(in_stack_00000068,in_stack_00000064);
        if (iVar3 == 0) {
          return 1;
        }
        bVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
      }
    }
    if (in_RDI->progressive != 0) {
      stbi__jpeg_finish(in_RDI);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__decode_jpeg_image(stbi__jpeg *j)
{
   int m;
   for (m = 0; m < 4; m++) {
      j->img_comp[m].raw_data = NULL;
      j->img_comp[m].raw_coeff = NULL;
   }
   j->restart_interval = 0;
   if (!stbi__decode_jpeg_header(j, STBI__SCAN_load)) return 0;
   m = stbi__get_marker(j);
   while (!stbi__EOI(m)) {
      if (stbi__SOS(m)) {
         if (!stbi__process_scan_header(j)) return 0;
         if (!stbi__parse_entropy_coded_data(j)) return 0;
         if (j->marker == STBI__MARKER_none ) {
         j->marker = stbi__skip_jpeg_junk_at_end(j);
            // if we reach eof without hitting a marker, stbi__get_marker() below will fail and we'll eventually return 0
         }
         m = stbi__get_marker(j);
         if (STBI__RESTART(m))
            m = stbi__get_marker(j);
      } else if (stbi__DNL(m)) {
         int Ld = stbi__get16be(j->s);
         stbi__uint32 NL = stbi__get16be(j->s);
         if (Ld != 4) return stbi__err("bad DNL len", "Corrupt JPEG");
         if (NL != j->s->img_y) return stbi__err("bad DNL height", "Corrupt JPEG");
         m = stbi__get_marker(j);
      } else {
         if (!stbi__process_marker(j, m)) return 1;
         m = stbi__get_marker(j);
      }
   }
   if (j->progressive)
      stbi__jpeg_finish(j);
   return 1;
}